

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O0

bool runArmips(ArmipsArguments *arguments)

{
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this;
  CMacro *this_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppCVar5;
  reference ppCVar6;
  ulong local_78;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  StringList errors;
  bool result;
  wstring local_38 [8];
  wstring equline;
  ulong local_18;
  size_t i;
  ArmipsArguments *arguments_local;
  
  Global.Radix = 10;
  Global.Revalidate = true;
  Global.Section = 0;
  Global.nocash = false;
  Global.IncludeNestingLevel = 0;
  Global.MacroNestingLevel = 0;
  Global.FileInfo.FileCount = 0;
  Global.FileInfo.TotalLineCount = 0;
  Global.DebugMessages = 0;
  Global.relativeInclude = false;
  Global.validationPasses = 0;
  Arch = &InvalidArchitecture.super_CArchitecture;
  Logger::clear();
  SymbolData::clear(&Global.symData);
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  TempData::clear(&Global.tempData);
  ConditionData::clear(&Global.conditionData);
  AreaData::clear(&Global.areaData);
  std::vector<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>::clear(&Global.Commands);
  std::vector<CMacro_*,_std::allocator<CMacro_*>_>::clear(&Global.Macros);
  CStringList::Clear(&Global.FileInfo.FileList);
  Global.FileInfo.FileCount = 0;
  Global.FileInfo.TotalLineCount = 0;
  Global.FileInfo.LineNumber = 0;
  Global.FileInfo.FileNum = 0;
  CArmArchitecture::clear(&Arm);
  Logger::setSilent((bool)(arguments->silent & 1));
  Logger::setErrorOnWarning((bool)(arguments->errorOnWarning & 1));
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    SymbolData::setNocashSymFileName
              (&Global.symData,&arguments->symFileName,arguments->symFileVersion);
  }
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    TempData::setFileName(&Global.tempData,&arguments->tempFileName);
  }
  for (local_18 = 0;
      sVar3 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size(&arguments->equList), local_18 < sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::at(&arguments->equList,local_18);
    std::__cxx11::wstring::wstring(local_38,(wstring *)pvVar4);
    CheckEquLabel((wstring *)local_38);
    std::__cxx11::wstring::~wstring(local_38);
  }
  SymbolTable::addLabels(&Global.symbolTable,&arguments->labels);
  if (arguments->mode == File) {
    Global.memoryMode = false;
    LoadAssemblyFile(&arguments->inputFileName,GUESS);
  }
  else if (arguments->mode == Memory) {
    Global.memoryMode = true;
    Global.memoryFile = arguments->memoryFile;
    LoadAssemblyContent(&arguments->content);
  }
  bVar1 = Logger::hasError();
  errors.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = (bVar1 ^ 0xffU) & 1;
  if ((bool)errors.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ == true) {
    errors.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = EncodeAssembly();
  }
  if (arguments->errorsResult != (StringList *)0x0) {
    Logger::getErrors_abi_cxx11_();
    for (i_2 = 0; sVar3 = std::
                          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                  *)&i_1), i_2 < sVar3; i_2 = i_2 + 1) {
      this = arguments->errorsResult;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                             *)&i_1,i_2);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back(this,pvVar4);
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&i_1);
  }
  for (i_3 = 0; sVar3 = std::vector<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>::size
                                  (&Global.Commands), i_3 < sVar3; i_3 = i_3 + 1) {
    ppCVar5 = std::vector<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>::operator[]
                        (&Global.Commands,i_3);
    if (*ppCVar5 != (value_type)0x0) {
      (*(*ppCVar5)->_vptr_CAssemblerCommand[1])();
    }
  }
  for (local_78 = 0; sVar3 = std::vector<CMacro_*,_std::allocator<CMacro_*>_>::size(&Global.Macros),
      local_78 < sVar3; local_78 = local_78 + 1) {
    ppCVar6 = std::vector<CMacro_*,_std::allocator<CMacro_*>_>::operator[](&Global.Macros,local_78);
    this_00 = *ppCVar6;
    if (this_00 != (CMacro *)0x0) {
      CMacro::~CMacro(this_00);
      operator_delete(this_00);
    }
  }
  std::vector<CAssemblerCommand_*,_std::allocator<CAssemblerCommand_*>_>::clear(&Global.Commands);
  std::vector<CMacro_*,_std::allocator<CMacro_*>_>::clear(&Global.Macros);
  return (bool)(errors.
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1);
}

Assistant:

bool runArmips(ArmipsArguments& arguments)
{
	// initialize and reset global data
	Global.Radix = 10;
	Global.Revalidate = true;
	Global.Section = 0;
	Global.nocash = false;
	Global.IncludeNestingLevel = 0;
	Global.MacroNestingLevel = 0;
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.DebugMessages = 0;
	Global.relativeInclude = false;
	Global.validationPasses = 0;
	Arch = &InvalidArchitecture;

	Logger::clear();
	Global.symData.clear();
	Global.Table.clear();
	Global.symbolTable.clear();
	Global.tempData.clear();
	Global.conditionData.clear();
	Global.areaData.clear();
	Global.Commands.clear();
	Global.Macros.clear();

	Global.FileInfo.FileList.Clear();
	Global.FileInfo.FileCount = 0;
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	// process arguments
	Logger::setSilent(arguments.silent);
	Logger::setErrorOnWarning(arguments.errorOnWarning);

	if (!arguments.symFileName.empty())
		Global.symData.setNocashSymFileName(arguments.symFileName,arguments.symFileVersion);

	if (!arguments.tempFileName.empty())
		Global.tempData.setFileName(arguments.tempFileName);

	for (size_t i = 0; i < arguments.equList.size(); i++)
	{
		std::wstring equline = arguments.equList.at(i);
		CheckEquLabel(equline);
	}

	Global.symbolTable.addLabels(arguments.labels);

	// run assembler
	switch (arguments.mode)
	{
	case ArmipsMode::File:
		Global.memoryMode = false;
		LoadAssemblyFile(arguments.inputFileName);
		break;
	case ArmipsMode::Memory:
		Global.memoryMode = true;
		Global.memoryFile = arguments.memoryFile;
		LoadAssemblyContent(arguments.content);
		break;
	}

	bool result = !Logger::hasError();
	if (result == true)
		result = EncodeAssembly();

	// return errors
	if (arguments.errorsResult != NULL)
	{
		StringList errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			arguments.errorsResult->push_back(errors[i]);
	}

	// cleanup
	for (size_t i = 0; i < Global.Commands.size(); i++)
		delete Global.Commands[i];	

	for (size_t i = 0; i < Global.Macros.size(); i++)
		delete Global.Macros[i];

	Global.Commands.clear();
	Global.Macros.clear();

	return result;
}